

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O1

char * base64(void *binaryData,int len,int *flen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  
  bVar5 = (byte)(len % 3);
  iVar6 = ((uint)(byte)((bVar5 & 2) >> 1 | bVar5 * '\x02' & 3) + len) * 4;
  iVar4 = iVar6 >> 0x1f;
  iVar6 = iVar6 / 3 + iVar4;
  *flen = iVar6 - iVar4;
  pcVar7 = (char *)malloc((long)((iVar6 - iVar4) + 1));
  if (pcVar7 == (char *)0x0) {
    puts("ERROR: base64 could not allocate enough memory.");
    puts("I must stop because I could not get enough");
    return (char *)0x0;
  }
  if (len < 3) {
    lVar10 = 0;
    uVar8 = 0;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      bVar3 = *(byte *)((long)binaryData + lVar10);
      bVar1 = *(byte *)((long)binaryData + lVar10 + 1);
      bVar2 = *(byte *)((long)binaryData + lVar10 + 2);
      pcVar7[uVar8] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 >> 2]
      ;
      pcVar7[uVar8 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)(bVar1 >> 4) | (bVar3 & 3) << 4];
      pcVar7[uVar8 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)(bVar2 >> 6) + (bVar1 & 0xf) * 4];
      pcVar7[uVar8 + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 & 0x3f];
      uVar8 = uVar8 + 4;
      lVar10 = lVar10 + 3;
    } while (lVar10 <= len + -3);
  }
  iVar6 = (int)uVar8;
  if ((bVar5 & 3) == 2) {
    bVar5 = *(byte *)((long)binaryData + lVar10);
    pcVar7[uVar8 & 0xffffffff] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar5 >> 2];
    bVar3 = *(byte *)((long)binaryData + lVar10 + 1);
    pcVar7[(uVar8 & 0xffffffff) + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(uint)(bVar3 >> 4) | (bVar5 & 3) << 4];
    cVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
            [(ulong)(bVar3 & 0xf) * 4];
  }
  else {
    if ((len % 3 & 3U) != 1) goto LAB_0020b502;
    bVar5 = *(byte *)((long)binaryData + lVar10);
    pcVar7[uVar8 & 0xffffffff] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar5 >> 2];
    pcVar7[(uVar8 & 0xffffffff) + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(bVar5 & 3) << 4];
    cVar9 = '=';
  }
  pcVar7[(uVar8 & 0xffffffff) + 2] = cVar9;
  iVar6 = iVar6 + 4;
  pcVar7[(uVar8 & 0xffffffff) + 3] = '=';
LAB_0020b502:
  pcVar7[iVar6] = '\0';
  return pcVar7;
}

Assistant:

char* base64(const void* binaryData, int len, int *flen) {
	const unsigned char* bin = (const unsigned char*) binaryData;
	char* res;

	int rc = 0; // result counter
	int byteNo; // I need this after the loop

	int modulusLen = len % 3;
	int pad = ((modulusLen & 1) << 1) + ((modulusLen & 2) >> 1); // 2 gives 1 and 1 gives 2, but 0 gives 0.

	*flen = 4 * (len + pad) / 3;
	res = (char*) malloc(*flen + 1); // and one for the null
	if (!res) {
		puts("ERROR: base64 could not allocate enough memory.");
		puts("I must stop because I could not get enough");
		return 0;
	}

	for (byteNo = 0; byteNo <= len - 3; byteNo += 3) {
		unsigned char BYTE0 = bin[byteNo];
		unsigned char BYTE1 = bin[byteNo + 1];
		unsigned char BYTE2 = bin[byteNo + 2];
		res[rc++] = b64[BYTE0 >> 2];
		res[rc++] = b64[((0x3 & BYTE0) << 4) + (BYTE1 >> 4)];
		res[rc++] = b64[((0x0f & BYTE1) << 2) + (BYTE2 >> 6)];
		res[rc++] = b64[0x3f & BYTE2];
	}

	if (pad == 2) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[(0x3 & bin[byteNo]) << 4];
		res[rc++] = '=';
		res[rc++] = '=';
	} else if (pad == 1) {
		res[rc++] = b64[bin[byteNo] >> 2];
		res[rc++] = b64[((0x3 & bin[byteNo]) << 4) + (bin[byteNo + 1] >> 4)];
		res[rc++] = b64[(0x0f & bin[byteNo + 1]) << 2];
		res[rc++] = '=';
	}

	res[rc] = 0; // NULL TERMINATOR! ;)
	return res;
}